

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml.c
# Opt level: O1

xml_string * xml_parse_tag_end(xml_parser *parser)

{
  size_t sVar1;
  ulong uVar2;
  bool bVar3;
  byte bVar4;
  uint8_t uVar5;
  ushort **ppuVar6;
  ulong uVar7;
  ulong uVar8;
  xml_string *pxVar9;
  size_t sVar10;
  
  sVar1 = parser->position;
  uVar2 = parser->length;
  sVar10 = 0;
  do {
    if (uVar2 <= sVar10 + sVar1) break;
    bVar3 = false;
    bVar4 = xml_parser_peek(parser,0);
    if (bVar4 != 0x3e) {
      ppuVar6 = __ctype_b_loc();
      if ((*(byte *)((long)*ppuVar6 + (ulong)bVar4 * 2 + 1) & 0x20) == 0) {
        uVar7 = parser->position + 1;
        if (uVar2 <= uVar7) {
          uVar7 = uVar2 - 1;
        }
        parser->position = uVar7;
        sVar10 = sVar10 + 1;
        bVar3 = true;
      }
      else {
        bVar3 = false;
      }
    }
  } while (bVar3);
  uVar5 = xml_parser_peek(parser,0);
  if (uVar5 == '>') {
    uVar8 = parser->position + 1;
    uVar7 = uVar2 - 1;
    if (uVar8 < uVar2) {
      uVar7 = uVar8;
    }
    parser->position = uVar7;
    pxVar9 = (xml_string *)malloc(0x10);
    pxVar9->buffer = parser->buffer + sVar1;
    pxVar9->length = sVar10;
  }
  else {
    pxVar9 = (xml_string *)0x0;
    xml_parser_error(parser,CURRENT_CHARACTER,"xml_parse_tag_end::expected tag end");
  }
  return pxVar9;
}

Assistant:

static struct xml_string* xml_parse_tag_end(struct xml_parser* parser) {
	xml_parser_info(parser, "tag_end");
	size_t start = parser->position;
	size_t length = 0;

	/* Parse until `>' or a whitespace is reached
	 */
	while (start + length < parser->length) {
		uint8_t current = xml_parser_peek(parser, CURRENT_CHARACTER);

		if (('>' == current) || isspace(current)) {
			break;
		} else {
			xml_parser_consume(parser, 1);
			length++;
		}
	}

	/* Consume `>'
	 */
	if ('>' != xml_parser_peek(parser, CURRENT_CHARACTER)) {
		xml_parser_error(parser, CURRENT_CHARACTER, "xml_parse_tag_end::expected tag end");
		return 0;
	}
	xml_parser_consume(parser, 1);

	/* Return parsed tag name
	 */
	struct xml_string* name = malloc(sizeof(struct xml_string));
	name->buffer = &parser->buffer[start];
	name->length = length;
	return name;
}